

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O1

REF_STATUS
ref_part_meshb_geom_bcast
          (REF_GEOM ref_geom,REF_LONG ngeom,REF_INT type,REF_NODE ref_node,REF_INT version,
          FILE *file)

{
  long *plVar1;
  REF_MPI ref_mpi;
  REF_STATUS RVar2;
  long lVar3;
  void *data;
  void *data_00;
  void *data_01;
  REF_DBL *data_02;
  size_t sVar4;
  ulong uVar5;
  uint uVar6;
  undefined8 uVar7;
  size_t __size;
  uint uVar8;
  ulong uVar9;
  char *pcVar10;
  REF_DBL *pRVar11;
  REF_INT n;
  ulong uVar12;
  FILE *file_00;
  REF_INT local;
  REF_INT new_geom;
  REF_DBL double_gref;
  int local_8c;
  FILE *local_88;
  REF_GEOM local_80;
  int local_74;
  REF_DBL *local_70;
  ulong local_68;
  REF_NODE local_60;
  ulong local_58;
  REF_LONG *local_50;
  ulong local_48;
  long local_40;
  double local_38;
  
  ref_mpi = ref_node->ref_mpi;
  lVar3 = ngeom / (long)ref_mpi->n;
  uVar9 = (ulong)(int)lVar3;
  if (lVar3 < 1000000) {
    uVar9 = 1000000;
  }
  if (ngeom <= (long)uVar9) {
    uVar9 = ngeom;
  }
  uVar8 = (uint)uVar9;
  local_80 = ref_geom;
  if ((int)uVar8 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",0x160,
           "ref_part_meshb_geom_bcast","malloc read_node of REF_LONG negative");
    RVar2 = 1;
  }
  else {
    __size = (ulong)(uVar8 & 0x7fffffff) << 3;
    data = malloc(__size);
    if (data == (void *)0x0) {
      pcVar10 = "malloc read_node of REF_LONG NULL";
      uVar7 = 0x160;
    }
    else {
      data_00 = malloc(__size);
      if (data_00 == (void *)0x0) {
        pcVar10 = "malloc read_id of REF_LONG NULL";
        uVar7 = 0x161;
      }
      else {
        data_01 = malloc(__size);
        if (data_01 == (void *)0x0) {
          pcVar10 = "malloc read_gref of REF_LONG NULL";
          uVar7 = 0x162;
        }
        else {
          data_02 = (REF_DBL *)malloc((ulong)(uVar8 & 0x7fffffff) << 4);
          if (data_02 != (REF_DBL *)0x0) {
            if (0 < ngeom) {
              local_48 = (ulong)(uint)type;
              lVar3 = 0;
              local_88 = (FILE *)file;
              local_60 = ref_node;
              do {
                uVar6 = (int)ngeom - (int)lVar3;
                local_68 = (ulong)uVar6;
                if ((int)uVar8 < (int)uVar6) {
                  local_68 = uVar9 & 0xffffffff;
                }
                local_40 = lVar3;
                if (ref_mpi->id == 0) {
                  if (0 < (int)local_68) {
                    uVar5 = 0;
                    file_00 = local_88;
                    local_70 = data_02;
                    local_58 = local_68;
                    do {
                      RVar2 = ref_part_meshb_long((FILE *)file_00,version,
                                                  (REF_LONG *)((long)data + uVar5 * 8));
                      if (RVar2 != 0) {
                        __size = 1;
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                               ,0x16a,"ref_part_meshb_geom_bcast",1,"node");
                      }
                      if (RVar2 != 0) {
                        return (REF_STATUS)__size;
                      }
                      local_50 = (REF_LONG *)((long)data_00 + uVar5 * 8);
                      RVar2 = ref_part_meshb_long((FILE *)file_00,version,local_50);
                      if (RVar2 != 0) {
                        __size = 1;
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                               ,0x16b,"ref_part_meshb_geom_bcast",1,"node");
                      }
                      if (RVar2 != 0) {
                        return (REF_STATUS)__size;
                      }
                      data_02[uVar5 * 2] = 0.0;
                      (data_02 + uVar5 * 2)[1] = 0.0;
                      pRVar11 = local_70;
                      uVar12 = local_48;
                      if (0 < type) {
                        do {
                          sVar4 = fread(pRVar11,8,1,local_88);
                          if (sVar4 != 1) {
                            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                   ,0x170,"ref_part_meshb_geom_bcast","param",1,sVar4);
                            __size = 1;
                          }
                          if (sVar4 != 1) {
                            return (REF_STATUS)__size;
                          }
                          pRVar11 = pRVar11 + 1;
                          uVar12 = uVar12 - 1;
                        } while (uVar12 != 0);
                      }
                      file_00 = local_88;
                      *(REF_LONG *)((long)data_01 + uVar5 * 8) = *local_50;
                      if (0 < type) {
                        sVar4 = fread(&local_38,8,1,local_88);
                        if (sVar4 != 1) {
                          printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                 ,0x173,"ref_part_meshb_geom_bcast","gref",1,sVar4);
                          __size = 1;
                        }
                        if (sVar4 != 1) {
                          return (REF_STATUS)__size;
                        }
                        *(long *)((long)data_01 + uVar5 * 8) = (long)local_38;
                      }
                      uVar5 = uVar5 + 1;
                      local_70 = local_70 + 2;
                    } while (uVar5 != local_58);
                  }
                  if (0 < (int)local_68) {
                    uVar5 = 0;
                    do {
                      plVar1 = (long *)((long)data + uVar5 * 8);
                      *plVar1 = *plVar1 + -1;
                      uVar5 = uVar5 + 1;
                    } while ((local_68 & 0xffffffff) != uVar5);
                  }
                }
                uVar5 = local_68;
                n = (REF_INT)local_68;
                uVar6 = ref_mpi_bcast(ref_mpi,data,n,2);
                if (uVar6 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x179,"ref_part_meshb_geom_bcast",(ulong)uVar6,"nd");
                  __size = (size_t)uVar6;
                }
                if (uVar6 != 0) {
                  return (REF_STATUS)__size;
                }
                uVar6 = ref_mpi_bcast(ref_mpi,data_00,n,2);
                if (uVar6 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x17a,"ref_part_meshb_geom_bcast",(ulong)uVar6,"id");
                  __size = (size_t)uVar6;
                }
                if (uVar6 != 0) {
                  return (REF_STATUS)__size;
                }
                uVar6 = ref_mpi_bcast(ref_mpi,data_01,n,2);
                if (uVar6 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x17b,"ref_part_meshb_geom_bcast",(ulong)uVar6,"gref");
                  __size = (size_t)uVar6;
                }
                if (uVar6 != 0) {
                  return (REF_STATUS)__size;
                }
                uVar6 = ref_mpi_bcast(ref_mpi,data_02,n * 2,3);
                if (uVar6 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x17d,"ref_part_meshb_geom_bcast",(ulong)uVar6,"pm");
                  __size = (size_t)uVar6;
                }
                if (uVar6 != 0) {
                  return (REF_STATUS)__size;
                }
                if (0 < n) {
                  uVar12 = 0;
                  pRVar11 = data_02;
                  do {
                    uVar6 = ref_node_local(local_60,*(REF_GLOB *)((long)data + uVar12 * 8),&local_8c
                                          );
                    if ((uVar6 != 0) && (uVar6 != 5)) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                             ,0x180,"ref_part_meshb_geom_bcast",(ulong)uVar6,"local");
                      __size = (size_t)uVar6;
                    }
                    if ((uVar6 != 5) && (uVar6 != 0)) {
                      return (REF_STATUS)__size;
                    }
                    if (local_8c != -1) {
                      uVar6 = ref_geom_add(local_80,local_8c,type,
                                           *(REF_INT *)((long)data_00 + uVar12 * 8),pRVar11);
                      if (uVar6 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                               ,0x184,"ref_part_meshb_geom_bcast",(ulong)uVar6,"add geom");
                        __size = (size_t)uVar6;
                      }
                      if (uVar6 != 0) {
                        return (REF_STATUS)__size;
                      }
                      uVar6 = ref_geom_find(local_80,local_8c,type,
                                            *(REF_INT *)((long)data_00 + uVar12 * 8),&local_74);
                      if (uVar6 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                               ,0x187,"ref_part_meshb_geom_bcast",(ulong)uVar6,"find");
                        __size = (size_t)uVar6;
                      }
                      if (uVar6 != 0) {
                        return (REF_STATUS)__size;
                      }
                      local_80->descr[(long)local_74 * 6 + 2] =
                           *(REF_INT *)((long)data_01 + uVar12 * 8);
                    }
                    uVar12 = uVar12 + 1;
                    pRVar11 = pRVar11 + 2;
                  } while ((uVar5 & 0xffffffff) != uVar12);
                }
                lVar3 = local_40 + (int)local_68;
              } while (lVar3 < ngeom);
            }
            free(data_02);
            free(data_01);
            free(data_00);
            free(data);
            return 0;
          }
          pcVar10 = "malloc read_param of REF_DBL NULL";
          uVar7 = 0x163;
        }
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar7,
           "ref_part_meshb_geom_bcast",pcVar10);
    RVar2 = 2;
  }
  return RVar2;
}

Assistant:

REF_FCN static REF_STATUS ref_part_meshb_geom_bcast(
    REF_GEOM ref_geom, REF_LONG ngeom, REF_INT type, REF_NODE ref_node,
    REF_INT version, FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT chunk;
  REF_LONG *read_node;
  REF_LONG *read_id;
  REF_LONG *read_gref;
  REF_DBL *read_param;
  REF_DBL double_gref;

  REF_LONG ngeom_read;
  REF_INT section_size;

  REF_INT geom, new_geom;
  REF_INT i, local;

  chunk = (REF_INT)MAX(1000000, ngeom / (REF_LONG)ref_mpi_n(ref_mpi));
  chunk = (REF_INT)MIN((REF_LONG)chunk, ngeom);

  ref_malloc(read_node, chunk, REF_LONG);
  ref_malloc(read_id, chunk, REF_LONG);
  ref_malloc(read_gref, chunk, REF_LONG);
  ref_malloc(read_param, 2 * chunk, REF_DBL);

  ngeom_read = 0;
  while (ngeom_read < ngeom) {
    section_size = MIN(chunk, (REF_INT)(ngeom - ngeom_read));
    if (ref_mpi_once(ref_mpi)) {
      for (geom = 0; geom < section_size; geom++) {
        RSS(ref_part_meshb_long(file, version, &(read_node[geom])), "node");
        RSS(ref_part_meshb_long(file, version, &(read_id[geom])), "node");
        for (i = 0; i < 2; i++)
          read_param[i + 2 * geom] = 0.0; /* ensure init */
        for (i = 0; i < type; i++)
          REIS(1, fread(&(read_param[i + 2 * geom]), sizeof(double), 1, file),
               "param");
        read_gref[geom] = read_id[geom];
        if (0 < type) {
          REIS(1, fread(&(double_gref), sizeof(double), 1, file), "gref");
          read_gref[geom] = (REF_LONG)double_gref;
        }
      }
      for (geom = 0; geom < section_size; geom++) read_node[geom]--;
    }
    RSS(ref_mpi_bcast(ref_mpi, read_node, section_size, REF_LONG_TYPE), "nd");
    RSS(ref_mpi_bcast(ref_mpi, read_id, section_size, REF_LONG_TYPE), "id");
    RSS(ref_mpi_bcast(ref_mpi, read_gref, section_size, REF_LONG_TYPE), "gref");
    RSS(ref_mpi_bcast(ref_mpi, read_param, 2 * section_size, REF_DBL_TYPE),
        "pm");
    for (geom = 0; geom < section_size; geom++) {
      RXS(ref_node_local(ref_node, read_node[geom], &local), REF_NOT_FOUND,
          "local");
      if (REF_EMPTY != local) {
        RSS(ref_geom_add(ref_geom, local, type, (REF_INT)read_id[geom],
                         &(read_param[2 * geom])),
            "add geom");
        RSS(ref_geom_find(ref_geom, local, type, (REF_INT)read_id[geom],
                          &new_geom),
            "find");
        ref_geom_gref(ref_geom, new_geom) = (REF_INT)read_gref[geom];
      }
    }
    ngeom_read += section_size;
  }

  ref_free(read_param);
  ref_free(read_gref);
  ref_free(read_id);
  ref_free(read_node);

  return REF_SUCCESS;
}